

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O3

void __thiscall QPDFJob::initializeFromJson(QPDFJob *this,string *json,bool partial)

{
  JSONHandler *this_00;
  element_type *peVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  runtime_error *this_01;
  _List_node_base *p_Var5;
  JSON j;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  ostringstream msg;
  JSON local_220;
  QPDFJob local_210;
  JSON local_200;
  JSON local_1f0;
  string local_1e0;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  Handlers local_1a8 [2];
  
  local_1c0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_1c0;
  local_1c0._M_impl._M_node._M_size = 0;
  local_1c0._M_impl._M_node.super__List_node_base._M_prev =
       local_1c0._M_impl._M_node.super__List_node_base._M_next;
  JSON::parse(&local_220,json);
  local_200.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       JOB_SCHEMA.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_200.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       JOB_SCHEMA.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (JOB_SCHEMA.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (JOB_SCHEMA.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (JOB_SCHEMA.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (JOB_SCHEMA.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (JOB_SCHEMA.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  bVar3 = JSON::checkSchema(&local_220,&local_200,1,
                            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_1c0);
  if (local_200.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_200.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (bVar3) {
    config(&local_210);
    local_1a8[0].json_handlers.
    super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8[0].json_handlers.
    super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8[0].json_handlers.
    super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8[0].jh = (JSONHandler *)0x0;
    local_1a8[0].c_main.super___shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_210.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1a8[0].c_main.super___shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_210.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
    if (local_210.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_210.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_210.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_210.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_210.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_1a8[0].accumulated_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8[0].accumulated_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8[0].c_enc.super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1a8[0].c_enc.super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1a8[0].c_uo.super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1a8[0].c_uo.super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1a8[0].c_pages.super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_1a8[0].c_pages.super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1a8[0].c_att.super___shared_ptr<QPDFJob::AttConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1a8[0].c_att.super___shared_ptr<QPDFJob::AttConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1a8[0].c_copy_att.super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_1a8[0].c_copy_att.super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1a8[0].accumulated_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8[0].partial = partial;
    anon_unknown.dwarf_4c968b::Handlers::initHandlers(local_1a8);
    this_00 = local_1a8[0].json_handlers.
              super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1e0.field_2._M_allocated_capacity._0_2_ = 0x2e;
    local_1e0._M_string_length = 1;
    local_1f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_220.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_220.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (local_220.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_220.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_220.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_220.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_220.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    JSONHandler::handle(this_00,&local_1e0,&local_1f0);
    if (local_1f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,
                      CONCAT62(local_1e0.field_2._M_allocated_capacity._2_6_,
                               local_1e0.field_2._M_allocated_capacity._0_2_) + 1);
    }
    anon_unknown.dwarf_4c968b::Handlers::~Handlers(local_1a8);
    if (local_210.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_210.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_220.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_220.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_1c0);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(peVar1->message_prefix)._M_dataplus._M_p,
                      (peVar1->message_prefix)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,": job json has errors:",0x16);
  p_Var5 = (_List_node_base *)&local_1c0;
  while (p_Var5 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)&local_1c0) {
    cVar2 = (char)local_1a8;
    std::ios::widen((char)local_1a8[0].json_handlers.
                          super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-2].
                          super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi + cVar2);
    std::ostream::put(cVar2);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,(char *)p_Var5[1]._M_next,(long)p_Var5[1]._M_prev);
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_01,(string *)&local_1e0);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDFJob::initializeFromJson(std::string const& json, bool partial)
{
    std::list<std::string> errors;
    JSON j = JSON::parse(json);
    if (!j.checkSchema(JOB_SCHEMA, JSON::f_optional, errors)) {
        std::ostringstream msg;
        msg << m->message_prefix << ": job json has errors:";
        for (auto const& error: errors) {
            msg << std::endl << "  " << error;
        }
        throw std::runtime_error(msg.str());
    }

    Handlers(partial, config()).handle(j);
}